

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_5,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in0;
  Vector<float,_2> local_60;
  undefined1 local_58 [16];
  float local_48 [2];
  Vector<float,_3> local_40;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,5>((ShaderEvalContext *)local_58,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)local_58,(float *)s_constInMat2x2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_60.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_60,(Vector<float,_2> *)(s_constInVec2 + 8));
  }
  tcu::operator*((tcu *)local_48,(Matrix<float,_2,_2> *)local_58,&local_60);
  local_40.m_data[0] = local_48[0];
  local_40.m_data[1] = local_48[1];
  local_40.m_data[2] = local_48[0];
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_40);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}